

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xc_functional.cxx
# Opt level: O0

void __thiscall
ExchCXX::XCFunctional::eval_exc_vxc
          (XCFunctional *this,int N,const_host_buffer_type rho,const_host_buffer_type sigma,
          host_buffer_type eps,host_buffer_type vrho,host_buffer_type vsigma)

{
  ulong uVar1;
  bool bVar2;
  undefined8 uVar3;
  size_type sVar4;
  exchcxx_exception *peVar5;
  const_reference pvVar6;
  int in_ESI;
  XCFunctional *in_RDI;
  double **in_R8;
  exchcxx_exception *in_R9;
  exchcxx_exception *in_stack_00000008;
  double *vsigma_eval;
  double *vrho_eval;
  double *eps_eval;
  unsigned_long i;
  vector<double,_std::allocator<double>_> vsigma_scr;
  vector<double,_std::allocator<double>_> vrho_scr;
  vector<double,_std::allocator<double>_> eps_scr;
  size_t len_vsigma_buffer;
  size_t len_vrho_buffer;
  size_t len_exc_buffer;
  exchcxx_exception **in_stack_fffffffffffffe48;
  XCFunctional *in_stack_fffffffffffffe50;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe58;
  string *in_stack_fffffffffffffe60;
  allocator<char> *in_stack_fffffffffffffe68;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe70;
  string *in_stack_fffffffffffffe78;
  allocator<char> *in_stack_fffffffffffffe80;
  string *in_stack_fffffffffffffe88;
  exchcxx_exception *in_stack_fffffffffffffe90;
  double **in_stack_fffffffffffffe98;
  XCFunctional *in_stack_fffffffffffffec0;
  exchcxx_exception *local_128;
  exchcxx_exception *local_120;
  double **local_118;
  ulong local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  vector<double,_std::allocator<double>_> *local_a8;
  allocator<char> *local_a0;
  string *local_98;
  undefined1 local_8a;
  exchcxx_exception *local_30;
  double **local_28;
  int local_c;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_c = in_ESI;
  throw_if_not_sane(in_stack_fffffffffffffec0);
  bVar2 = is_gga((XCFunctional *)in_stack_fffffffffffffe60);
  if (bVar2) {
    local_98 = (string *)exc_buffer_len(in_RDI,(long)local_c);
    local_a0 = (allocator<char> *)
               vrho_buffer_len(in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
    local_a8 = (vector<double,_std::allocator<double>_> *)
               vsigma_buffer_len(in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x183148);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x183155);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x183162);
    sVar4 = std::
            vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
            ::size(&in_RDI->kernels_);
    if ((1 < sVar4) &&
       (bVar2 = supports_inc_interface((XCFunctional *)in_stack_fffffffffffffe60), !bVar2)) {
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_fffffffffffffe70,(size_type)in_stack_fffffffffffffe68);
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_fffffffffffffe70,(size_type)in_stack_fffffffffffffe68);
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_fffffffffffffe70,(size_type)in_stack_fffffffffffffe68);
    }
    local_f8 = 0;
    std::fill_n<double*,unsigned_long,double>
              ((double *)in_stack_fffffffffffffe70,(unsigned_long)in_stack_fffffffffffffe68,
               (double *)in_stack_fffffffffffffe60);
    local_100 = 0;
    std::fill_n<double*,unsigned_long,double>
              ((double *)in_stack_fffffffffffffe70,(unsigned_long)in_stack_fffffffffffffe68,
               (double *)in_stack_fffffffffffffe60);
    local_108 = 0;
    std::fill_n<double*,unsigned_long,double>
              ((double *)in_stack_fffffffffffffe70,(unsigned_long)in_stack_fffffffffffffe68,
               (double *)in_stack_fffffffffffffe60);
    for (local_110 = 0; uVar1 = local_110,
        sVar4 = std::
                vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                ::size(&in_RDI->kernels_), uVar1 < sVar4; local_110 = local_110 + 1) {
      bVar2 = supports_inc_interface((XCFunctional *)in_stack_fffffffffffffe60);
      if (bVar2) {
        std::
        vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
        ::operator[](&in_RDI->kernels_,local_110);
        bVar2 = XCKernel::is_gga((XCKernel *)0x183304);
        if (bVar2) {
          std::
          vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
          ::operator[](&in_RDI->kernels_,local_110);
          std::
          vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
          ::operator[](&in_RDI->kernels_,local_110);
          in_stack_fffffffffffffe50 = (XCFunctional *)&stack0x00000008;
          in_stack_fffffffffffffe48 = &local_30;
          XCKernel::
          eval_exc_vxc_inc<double_const&,int&,double_const*&,double_const*&,double*&,double*&,double*&>
                    ((XCKernel *)in_stack_fffffffffffffe80,(double *)in_stack_fffffffffffffe78,
                     (int *)in_stack_fffffffffffffe70,(double **)in_stack_fffffffffffffe68,
                     (double **)in_stack_fffffffffffffe60,(double **)in_stack_fffffffffffffe58,
                     (double **)in_stack_fffffffffffffe90,in_stack_fffffffffffffe98);
        }
        else {
          std::
          vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
          ::operator[](&in_RDI->kernels_,local_110);
          std::
          vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
          ::operator[](&in_RDI->kernels_,local_110);
          XCKernel::eval_exc_vxc_inc<double_const&,int&,double_const*&,double*&,double*&>
                    ((XCKernel *)in_stack_fffffffffffffe70,(double *)in_stack_fffffffffffffe68,
                     (int *)in_stack_fffffffffffffe60,(double **)in_stack_fffffffffffffe58,
                     (double **)in_stack_fffffffffffffe50,(double **)in_stack_fffffffffffffe48);
        }
      }
      else {
        in_stack_fffffffffffffe98 = local_28;
        if (local_110 != 0) {
          in_stack_fffffffffffffe98 =
               (double **)
               std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x183409);
        }
        in_stack_fffffffffffffe90 = local_30;
        local_118 = in_stack_fffffffffffffe98;
        if (local_110 != 0) {
          in_stack_fffffffffffffe90 =
               (exchcxx_exception *)
               std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x183442);
        }
        peVar5 = in_stack_00000008;
        local_120 = in_stack_fffffffffffffe90;
        if (local_110 != 0) {
          peVar5 = (exchcxx_exception *)
                   std::vector<double,_std::allocator<double>_>::data
                             ((vector<double,_std::allocator<double>_> *)0x18347b);
        }
        local_128 = peVar5;
        std::
        vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
        ::operator[](&in_RDI->kernels_,local_110);
        bVar2 = XCKernel::is_gga((XCKernel *)0x1834bd);
        if (bVar2) {
          std::
          vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
          ::operator[](&in_RDI->kernels_,local_110);
          in_stack_fffffffffffffe48 = &local_128;
          XCKernel::eval_exc_vxc<int&,double_const*&,double_const*&,double*&,double*&,double*&>
                    ((XCKernel *)in_stack_fffffffffffffe70,(int *)in_stack_fffffffffffffe68,
                     (double **)in_stack_fffffffffffffe60,(double **)in_stack_fffffffffffffe58,
                     (double **)in_stack_fffffffffffffe50,(double **)in_stack_fffffffffffffe48,
                     (double **)in_stack_fffffffffffffe80);
        }
        else {
          std::
          vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
          ::operator[](&in_RDI->kernels_,local_110);
          XCKernel::eval_exc_vxc<int&,double_const*&,double*&,double*&>
                    ((XCKernel *)in_stack_fffffffffffffe60,(int *)in_stack_fffffffffffffe58,
                     (double **)in_stack_fffffffffffffe50,(double **)in_stack_fffffffffffffe48,
                     (double **)0x18355f);
        }
        if (local_110 == 0) {
          in_stack_fffffffffffffe60 = local_98;
          pvVar6 = std::
                   vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                   ::operator[](&in_RDI->kernels_,0);
          _scal((size_t)in_stack_fffffffffffffe60,pvVar6->first,(double *)local_28);
          in_stack_fffffffffffffe68 = local_a0;
          pvVar6 = std::
                   vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                   ::operator[](&in_RDI->kernels_,local_110);
          _scal((size_t)in_stack_fffffffffffffe68,pvVar6->first,(double *)local_30);
          std::
          vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
          ::operator[](&in_RDI->kernels_,local_110);
          bVar2 = XCKernel::is_gga((XCKernel *)0x1836ef);
          if (bVar2) {
            in_stack_fffffffffffffe58 = local_a8;
            pvVar6 = std::
                     vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                     ::operator[](&in_RDI->kernels_,local_110);
            _scal((size_t)in_stack_fffffffffffffe58,pvVar6->first,(double *)in_stack_00000008);
          }
        }
        else {
          in_stack_fffffffffffffe78 = local_98;
          pvVar6 = std::
                   vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                   ::operator[](&in_RDI->kernels_,local_110);
          _addscal((size_t)in_stack_fffffffffffffe78,pvVar6->first,(double *)local_28,
                   (double *)local_118);
          in_stack_fffffffffffffe80 = local_a0;
          pvVar6 = std::
                   vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                   ::operator[](&in_RDI->kernels_,local_110);
          _addscal((size_t)in_stack_fffffffffffffe80,pvVar6->first,(double *)local_30,
                   (double *)local_120);
          std::
          vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
          ::operator[](&in_RDI->kernels_,local_110);
          bVar2 = XCKernel::is_gga((XCKernel *)0x183613);
          if (bVar2) {
            in_stack_fffffffffffffe70 = local_a8;
            pvVar6 = std::
                     vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                     ::operator[](&in_RDI->kernels_,local_110);
            _addscal((size_t)in_stack_fffffffffffffe70,pvVar6->first,(double *)in_stack_00000008,
                     (double *)local_128);
          }
        }
      }
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe60);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe60);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe60);
    return;
  }
  local_8a = 1;
  uVar3 = __cxa_allocate_exception(0x50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  exchcxx_exception::exchcxx_exception
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
             (int)((ulong)in_stack_fffffffffffffe80 >> 0x20),in_stack_fffffffffffffe78);
  local_8a = 0;
  __cxa_throw(uVar3,&exchcxx_exception::typeinfo,exchcxx_exception::~exchcxx_exception);
}

Assistant:

GGA_EXC_VXC_GENERATOR( XCFunctional::eval_exc_vxc ) const {

  throw_if_not_sane();
  EXCHCXX_BOOL_CHECK("KERNEL IS NOT GGA",  is_gga() );

  const size_t len_exc_buffer    = exc_buffer_len(N);
  const size_t len_vrho_buffer   = vrho_buffer_len(N);
  const size_t len_vsigma_buffer = vsigma_buffer_len(N);

  std::vector<double> eps_scr, vrho_scr, vsigma_scr;
  if( kernels_.size() > 1 and not supports_inc_interface() ) {
    eps_scr.resize( len_exc_buffer );
    vrho_scr.resize( len_vrho_buffer );
    vsigma_scr.resize( len_vsigma_buffer );
  }

  std::fill_n( eps, len_exc_buffer, 0. );
  std::fill_n( vrho, len_vrho_buffer, 0. );
  std::fill_n( vsigma, len_vsigma_buffer, 0. );

  for( auto i = 0ul; i < kernels_.size(); ++i ) {

    if( supports_inc_interface() ) {

      if( kernels_[i].second.is_gga() )
        kernels_[i].second.eval_exc_vxc_inc(
          kernels_[i].first, N, rho, sigma, eps, vrho, 
          vsigma 
        );
      else
        kernels_[i].second.eval_exc_vxc_inc(
          kernels_[i].first, N, rho, eps, vrho
        );

    } else {

      double* eps_eval    = i ? eps_scr.data()    : eps;
      double* vrho_eval   = i ? vrho_scr.data()   : vrho;
      double* vsigma_eval = i ? vsigma_scr.data() : vsigma;

      if( kernels_[i].second.is_gga() )
        kernels_[i].second.eval_exc_vxc(N, rho, sigma, eps_eval, vrho_eval, 
          vsigma_eval );
      else
        kernels_[i].second.eval_exc_vxc(N, rho, eps_eval, vrho_eval);

      if( i ) {

        _addscal( len_exc_buffer,    kernels_[i].first, eps,    eps_eval  );
        _addscal( len_vrho_buffer,   kernels_[i].first, vrho,   vrho_eval );
   
        if( kernels_[i].second.is_gga() )
          _addscal( len_vsigma_buffer, kernels_[i].first, vsigma, vsigma_eval );

      } else {

        _scal( len_exc_buffer,    kernels_[i].first, eps  );
        _scal( len_vrho_buffer,   kernels_[i].first, vrho );

        if( kernels_[i].second.is_gga() )
          _scal( len_vsigma_buffer, kernels_[i].first, vsigma );

      }

    }
  
  }

}